

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_formats.c
# Opt level: O2

FMStructDescList get_localized_formats_dill(FMFormat f,dill_stream_conflict s)

{
  undefined8 *puVar1;
  FMStructDescList subformats;
  ulong uVar2;
  FMStructDescList subformats_00;
  long lVar3;
  long lVar4;
  
  uVar2 = 0x40;
  for (lVar3 = 0;
      (f->subformats != (FMFormat_conflict *)0x0 && (f->subformats[lVar3] != (FMFormat_conflict)0x0)
      ); lVar3 = lVar3 + 1) {
    uVar2 = uVar2 + 0x20;
  }
  subformats = (FMStructDescList)ffs_malloc(uVar2 & 0x1fffffffe0);
  *(undefined8 *)((long)subformats + (uVar2 - 8)) = 0;
  puVar1 = (undefined8 *)((long)&subformats[-1].format_name + uVar2);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined4 *)((long)subformats + (uVar2 - 0x10)) = 0;
  subformats_00 = subformats + (int)lVar3;
  for (lVar4 = 0; lVar3 + lVar4 != 0; lVar4 = lVar4 + -1) {
    generate_localized_subformat(f->subformats[(long)(int)lVar3 + lVar4 + -1],subformats_00,s);
    subformats_00 = subformats_00 + -1;
  }
  generate_localized_subformat(f,subformats,s);
  return subformats;
}

Assistant:

extern FMStructDescList
get_localized_formats_dill(FMFormat f, dill_stream s)
{
    FMStructDescList ret_list;
    int subformat_count = 0;
    while(f->subformats && (f->subformats[subformat_count] != NULL)) {
	subformat_count++;
    }
    ret_list = malloc(sizeof(ret_list[0]) * (subformat_count+2));
    int i = 0;
    ret_list[subformat_count+1].format_name = NULL;
    ret_list[subformat_count+1].field_list = NULL;
    ret_list[subformat_count+1].struct_size = 0;
    ret_list[subformat_count+1].opt_info = 0;
    for (i=0; i < subformat_count; i++) {
	generate_localized_subformat(f->subformats[subformat_count-i-1], &ret_list[subformat_count - i], s);
    }
    generate_localized_subformat(f, ret_list, s);
    return ret_list;
}